

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::std_table(spec *s)

{
  sequence *in_RDI;
  char_type in_stack_ffffffffffffff4f;
  character *in_stack_ffffffffffffff50;
  key *this;
  scanner_base in_stack_ffffffffffffff68;
  scanner_base in_stack_ffffffffffffff70;
  key *in_stack_ffffffffffffff78;
  repeat_at_least *in_stack_ffffffffffffff80;
  spec *in_stack_ffffffffffffff88;
  sequence *in_stack_ffffffffffffff90;
  spec *in_stack_ffffffffffffff98;
  key *in_stack_ffffffffffffffa0;
  
  character::character(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
  ws(in_stack_ffffffffffffff88);
  key::key(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ws(in_stack_ffffffffffffff88);
  this = (key *)&stack0xffffffffffffff68;
  character::character((character *)this,in_stack_ffffffffffffff4f);
  sequence::
  sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::syntax::key,toml::detail::repeat_at_least,toml::detail::character>
            (in_stack_ffffffffffffff90,(character *)in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (repeat_at_least *)in_stack_ffffffffffffff70._vptr_scanner_base,
             (character *)in_stack_ffffffffffffff68._vptr_scanner_base);
  character::~character((character *)0x7173bc);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  key::~key(this);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  character::~character((character *)0x7173ea);
  return in_RDI;
}

Assistant:

TOML11_INLINE sequence std_table(const spec& s)
{
    return sequence(character('['), ws(s), key(s), ws(s), character(']'));
}